

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O1

void UpdateChroma(fixed_y_t *src1,fixed_y_t *src2,fixed_t *dst,int uv_w,int rgb_bit_depth,
                 SharpYuvTransferFunctionType transfer_type)

{
  short sVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  lVar5 = (long)(uv_w * 2);
  iVar7 = 1;
  if (1 < uv_w) {
    iVar7 = uv_w;
  }
  lVar6 = (long)(uv_w * 4);
  lVar8 = 0;
  do {
    uVar2 = ScaleDown(src1[lVar8 * 2],src1[lVar8 * 2 + 1],src2[lVar8 * 2],src2[lVar8 * 2 + 1],
                      rgb_bit_depth,transfer_type);
    uVar3 = ScaleDown(src1[lVar5 + lVar8 * 2],src1[lVar5 + lVar8 * 2 + 1],src2[lVar5 + lVar8 * 2],
                      src2[lVar5 + lVar8 * 2 + 1],rgb_bit_depth,transfer_type);
    uVar4 = ScaleDown(src1[lVar6 + lVar8 * 2],src1[lVar6 + lVar8 * 2 + 1],src2[lVar6 + lVar8 * 2],
                      src2[lVar6 + lVar8 * 2 + 1],rgb_bit_depth,transfer_type);
    sVar1 = (short)((ulong)(uVar2 * 0x366d) + (ulong)(uVar3 * 0xb717) + (ulong)(uVar4 * 0x127c) +
                    0x8000 >> 0x10);
    dst[lVar8] = (short)uVar2 - sVar1;
    dst[uv_w + lVar8] = (short)uVar3 - sVar1;
    dst[lVar5 + lVar8] = (short)uVar4 - sVar1;
    lVar8 = lVar8 + 1;
  } while (iVar7 != (int)lVar8);
  return;
}

Assistant:

static void UpdateChroma(const fixed_y_t* src1, const fixed_y_t* src2,
                         fixed_t* dst, int uv_w, int rgb_bit_depth,
                         SharpYuvTransferFunctionType transfer_type) {
  int i = 0;
  do {
    const int r =
        ScaleDown(src1[0 * uv_w + 0], src1[0 * uv_w + 1], src2[0 * uv_w + 0],
                  src2[0 * uv_w + 1], rgb_bit_depth, transfer_type);
    const int g =
        ScaleDown(src1[2 * uv_w + 0], src1[2 * uv_w + 1], src2[2 * uv_w + 0],
                  src2[2 * uv_w + 1], rgb_bit_depth, transfer_type);
    const int b =
        ScaleDown(src1[4 * uv_w + 0], src1[4 * uv_w + 1], src2[4 * uv_w + 0],
                  src2[4 * uv_w + 1], rgb_bit_depth, transfer_type);
    const int W = RGBToGray(r, g, b);
    dst[0 * uv_w] = (fixed_t)(r - W);
    dst[1 * uv_w] = (fixed_t)(g - W);
    dst[2 * uv_w] = (fixed_t)(b - W);
    dst  += 1;
    src1 += 2;
    src2 += 2;
  } while (++i < uv_w);
}